

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutputTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_TestOutput_SetProgressIndicator_TestShell::createTest
          (TEST_TestOutput_SetProgressIndicator_TestShell *this)

{
  TEST_TestOutput_SetProgressIndicator_Test *this_00;
  TEST_TestOutput_SetProgressIndicator_TestShell *this_local;
  
  this_00 = (TEST_TestOutput_SetProgressIndicator_Test *)
            operator_new(0x40,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestOutputTest.cpp"
                         ,0x99);
  TEST_TestOutput_SetProgressIndicator_Test::TEST_TestOutput_SetProgressIndicator_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(TestOutput, SetProgressIndicator)
{
    printer->setProgressIndicator(".");
    printer->printCurrentTestEnded(*result);
    printer->setProgressIndicator("!");
    printer->printCurrentTestEnded(*result);
    printer->setProgressIndicator(".");
    printer->printCurrentTestEnded(*result);

    STRCMP_EQUAL(".!.", mock->getOutput().asCharString());
}